

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timecode.h
# Opt level: O0

void __thiscall ViconCGStream::VTimecode::Write(VTimecode *this,VBuffer *i_rBuffer)

{
  VBuffer *i_rBuffer_local;
  VTimecode *this_local;
  
  ViconCGStreamIO::VBuffer::Write<unsigned_char>(i_rBuffer,&this->m_Hours);
  ViconCGStreamIO::VBuffer::Write<unsigned_char>(i_rBuffer,&this->m_Minutes);
  ViconCGStreamIO::VBuffer::Write<unsigned_char>(i_rBuffer,&this->m_Seconds);
  ViconCGStreamIO::VBuffer::Write<unsigned_char>(i_rBuffer,&this->m_Frames);
  ViconCGStreamIO::VBuffer::Write<unsigned_short>(i_rBuffer,&this->m_Subframes);
  ViconCGStreamIO::VBuffer::Write<unsigned_short>(i_rBuffer,&this->m_SubframesPerFrame);
  ViconCGStreamIO::VBuffer::Write<unsigned_int>(i_rBuffer,&this->m_Standard);
  ViconCGStreamIO::VBuffer::Write<unsigned_int>(i_rBuffer,&this->m_UserBits);
  ViconCGStreamIO::VBuffer::Write<unsigned_char>(i_rBuffer,&this->m_FieldFlag);
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_Hours );
    i_rBuffer.Write( m_Minutes );
    i_rBuffer.Write( m_Seconds );
    i_rBuffer.Write( m_Frames );
    i_rBuffer.Write( m_Subframes );
    i_rBuffer.Write( m_SubframesPerFrame );
    i_rBuffer.Write( m_Standard );
    i_rBuffer.Write( m_UserBits );
    i_rBuffer.Write( m_FieldFlag );
  }